

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O2

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:2184:27)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  atomic<int> *paVar1;
  ostringstream *this;
  type tVar2;
  OutputWorker *this_00;
  Result flushResult;
  type handler;
  ptr local_1d0;
  string local_1b8;
  LogStringBuffer local_198;
  
  local_1d0.h = &handler;
  handler.this = (Connection *)base[1].next_;
  local_1d0.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:2184:27)>
                 *)base;
  local_1d0.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:2184:27)>
                 *)base;
  ptr::reset(&local_1d0);
  tVar2.this = handler.this;
  if (owner != (void *)0x0) {
    tonk::SessionOutgoing::Flush((SessionOutgoing *)&flushResult);
    if (flushResult.Error != (ErrorResult *)0x0) {
      tonk::Result::ToJson_abi_cxx11_(&local_1b8,&flushResult);
      if ((int)((tVar2.this)->Logger).ChannelMinLevel < 5) {
        local_198.ChannelName = ((tVar2.this)->Logger).ChannelName;
        this = &local_198.LogStream;
        local_198.LogLevel = Error;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::operator<<((ostream *)this,(string *)&((tVar2.this)->Logger).Prefix);
        std::operator<<((ostream *)this,"tonk_flush failed: ");
        std::operator<<((ostream *)this,(string *)&local_1b8);
        this_00 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_00,&local_198);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
      }
      std::__cxx11::string::~string((string *)&local_1b8);
      tonk::RefCounter::StartShutdown
                (&((tVar2.this)->super_IConnection).SelfRefCount,2,&flushResult);
    }
    LOCK();
    paVar1 = &((tVar2.this)->super_IConnection).SelfRefCount.RefCount;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    tonk::Result::~Result(&flushResult);
  }
  ptr::~ptr(&local_1d0);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }